

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O1

QStringList * __thiscall
QFileSystemTreeView::selection(QStringList *__return_storage_ptr__,QFileSystemTreeView *this)

{
  QForeachContainer<QList<QModelIndex>_> _container_219;
  QModelIndexList indexes;
  undefined1 auStack_88 [16];
  QModelIndex *local_78;
  long lStack_70;
  QModelIndex *local_68;
  QModelIndex *local_60;
  undefined4 local_58;
  QArrayDataPointer<QModelIndex> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::selectedRows((int)&local_50);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  auStack_88._8_8_ = local_50.d;
  local_78 = local_50.ptr;
  lStack_70 = local_50.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = local_50.ptr;
  local_60 = local_50.ptr + local_50.size;
  local_58 = 1;
  if (local_50.size * 0x18 != 0) {
    do {
      QFileSystemModel::fileInfo((QModelIndex *)auStack_88);
      QFileInfo::absoluteFilePath();
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      QFileInfo::~QFileInfo((QFileInfo *)auStack_88);
      local_68 = local_68 + 1;
    } while (local_68 != local_60);
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QModelIndex> *)(auStack_88 + 8));
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_50);
  return __return_storage_ptr__;
}

Assistant:

QStringList QFileSystemTreeView::selection() const {
    const QModelIndexList indexes = selectionModel()->selectedRows();
    QStringList selection;

    foreach (const QModelIndex &index, indexes) {
        selection << d->model->fileInfo(index).absoluteFilePath();
    }

    return selection;
}